

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

Bool Bezier_Up(black_PWorker worker,Int degree,TPoint *arc,TSplitter splitter,Long miny,Long maxy)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  TPoint *pTVar5;
  TPoint *pTVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  
  uVar7 = (ulong)(uint)degree;
  lVar3 = arc[uVar7].y;
  plVar9 = worker->top;
  if (lVar3 <= maxy && miny <= arc->y) {
    lVar2 = (long)worker->precision;
    uVar4 = arc->y & -lVar2;
    if (maxy <= (long)uVar4) {
      uVar4 = maxy;
    }
    uVar8 = miny;
    if ((miny <= lVar3) &&
       (miny = (lVar3 + lVar2) - 1U & -lVar2, uVar8 = miny,
       (ushort)((ushort)lVar3 & (short)worker->precision - 1U) == 0)) {
      if (worker->joint != '\0') {
        plVar9 = plVar9 + -1;
        worker->joint = '\0';
      }
      *plVar9 = arc[uVar7].x;
      plVar9 = plVar9 + 1;
      uVar8 = lVar2 + miny;
    }
    if (worker->fresh != '\0') {
      worker->cProfile->start = miny >> ((byte)worker->precision_bits & 0x3f);
      worker->fresh = '\0';
    }
    if ((long)uVar8 <= (long)uVar4) {
      pTVar5 = arc;
      if (worker->maxBuff <=
          plVar9 + ((long)(uVar4 - uVar8) >> ((byte)worker->precision_bits & 0x3f)) + 1) {
        worker->top = plVar9;
        worker->error = 0x62;
        return '\x01';
      }
      do {
        worker->joint = '\0';
        uVar1 = pTVar5->y;
        if ((long)uVar8 < (long)uVar1) {
          pTVar6 = pTVar5 + uVar7;
          lVar3 = uVar1 - pTVar5[uVar7].y;
          if (lVar3 < worker->precision_step) {
            *plVar9 = (long)((uVar8 - pTVar5[uVar7].y) * (pTVar5->x - pTVar6->x)) / lVar3 +
                      pTVar6->x;
            plVar9 = plVar9 + 1;
            pTVar6 = pTVar5 + -uVar7;
            uVar8 = uVar8 + (long)worker->precision;
          }
          else {
            (*splitter)(pTVar5);
          }
        }
        else {
          if (uVar1 == uVar8) {
            worker->joint = '\x01';
            *plVar9 = pTVar5->x;
            plVar9 = plVar9 + 1;
            uVar8 = uVar8 + (long)worker->precision;
          }
          pTVar6 = pTVar5 + -uVar7;
        }
      } while ((arc <= pTVar6) && (pTVar5 = pTVar6, (long)uVar8 <= (long)uVar4));
    }
  }
  worker->top = plVar9;
  return '\0';
}

Assistant:

static Bool
  Bezier_Up( RAS_ARGS Int        degree,
                      TPoint*    arc,
                      TSplitter  splitter,
                      Long       miny,
                      Long       maxy )
  {
    Long   y1, y2, e, e2, e0;
    Short  f1;

    TPoint*  start_arc;

    PLong top;


    y1  = arc[degree].y;
    y2  = arc[0].y;
    top = ras.top;

    if ( y2 < miny || y1 > maxy )
      goto Fin;

    e2 = FLOOR( y2 );

    if ( e2 > maxy )
      e2 = maxy;

    e0 = miny;

    if ( y1 < miny )
      e = miny;
    else
    {
      e  = CEILING( y1 );
      f1 = (Short)( FRAC( y1 ) );
      e0 = e;

      if ( f1 == 0 )
      {
        if ( ras.joint )
        {
          top--;
          ras.joint = FALSE;
        }

        *top++ = arc[degree].x;

        e += ras.precision;
      }
    }

    if ( ras.fresh )
    {
      ras.cProfile->start = TRUNC( e0 );
      ras.fresh = FALSE;
    }

    if ( e2 < e )
      goto Fin;

    if ( ( top + TRUNC( e2 - e ) + 1 ) >= ras.maxBuff )
    {
      ras.top   = top;
      ras.error = FT_THROW( Raster_Overflow );
      return FAILURE;
    }

    start_arc = arc;

    do
    {
      ras.joint = FALSE;

      y2 = arc[0].y;

      if ( y2 > e )
      {
        y1 = arc[degree].y;
        if ( y2 - y1 >= ras.precision_step )
        {
          splitter( arc );
          arc += degree;
        }
        else
        {
          *top++ = arc[degree].x + FMulDiv( arc[0].x - arc[degree].x,
                                            e - y1, y2 - y1 );
          arc -= degree;
          e   += ras.precision;
        }
      }
      else
      {
        if ( y2 == e )
        {
          ras.joint  = TRUE;
          *top++     = arc[0].x;

          e += ras.precision;
        }
        arc -= degree;
      }
    } while ( arc >= start_arc && e <= e2 );

  Fin:
    ras.top  = top;
    return SUCCESS;
  }